

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_free(void **argtable)

{
  byte bVar1;
  int local_1c;
  int flag;
  int tabindex;
  arg_hdr **table;
  void **argtable_local;
  
  local_1c = 0;
  do {
    if (argtable[local_1c] == (void *)0x0) {
      return;
    }
    bVar1 = *argtable[local_1c];
    argtable3_xfree(argtable[local_1c]);
    argtable[local_1c] = (void *)0x0;
    local_1c = local_1c + 1;
  } while ((bVar1 & 1) == 0);
  return;
}

Assistant:

void arg_free(void** argtable) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int tabindex = 0;
    int flag;
    /*printf("arg_free(%p)\n",argtable);*/
    do {
        /*
           if we encounter a NULL entry then somewhat incorrectly we presume
           we have come to the end of the array. It isnt strictly true because
           an intermediate entry could be NULL with other non-NULL entries to follow.
           The subsequent argtable entries would then not be freed as they should.
         */
        if (table[tabindex] == NULL)
            break;

        flag = table[tabindex]->flag;
        xfree(table[tabindex]);
        table[tabindex++] = NULL;

    } while (!(flag & ARG_TERMINATOR));
}